

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

unsigned_short ncnn::float32_to_float16(float value)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = (uint)value >> 0x17;
  if ((char)uVar2 == -1) {
    return (short)(((uint)value >> 0x1f) << 0xf) + (ushort)(((uint)value & 0x7fffff) != 0) * 0x200 +
           0x7c00;
  }
  uVar3 = uVar2 & 0xff;
  uVar1 = (ushort)(((uint)value >> 0x1f) << 0xf);
  if (uVar3 != 0) {
    if (uVar3 < 0x8f) {
      if (0x70 < uVar3) {
        return (short)(((uint)value & 0x7fffff) >> 0xd) + (short)(uVar2 << 10) + 0x4000U | uVar1;
      }
    }
    else {
      uVar1 = uVar1 | 0x7c00;
    }
  }
  return uVar1;
}

Assistant:

unsigned short float32_to_float16(float value)
{
    // 1 : 8 : 23
    union
    {
        unsigned int u;
        float f;
    } tmp;

    tmp.f = value;

    // 1 : 8 : 23
    unsigned short sign = (tmp.u & 0x80000000) >> 31;
    unsigned short exponent = (tmp.u & 0x7F800000) >> 23;
    unsigned int significand = tmp.u & 0x7FFFFF;

    //     NCNN_LOGE("%d %d %d", sign, exponent, significand);

    // 1 : 5 : 10
    unsigned short fp16;
    if (exponent == 0)
    {
        // zero or denormal, always underflow
        fp16 = (sign << 15) | (0x00 << 10) | 0x00;
    }
    else if (exponent == 0xFF)
    {
        // infinity or NaN
        fp16 = (sign << 15) | (0x1F << 10) | (significand ? 0x200 : 0x00);
    }
    else
    {
        // normalized
        short newexp = exponent + (-127 + 15);
        if (newexp >= 31)
        {
            // overflow, return infinity
            fp16 = (sign << 15) | (0x1F << 10) | 0x00;
        }
        else if (newexp <= 0)
        {
            // Some normal fp32 cannot be expressed as normal fp16
            fp16 = (sign << 15) | (0x00 << 10) | 0x00;
        }
        else
        {
            // normal fp16
            fp16 = (sign << 15) | (newexp << 10) | (significand >> 13);
        }
    }

    return fp16;
}